

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarDelegate::paint
          (QCalendarDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  long lVar1;
  bool bVar2;
  int row;
  QDate in_RCX;
  QModelIndex *in_RDX;
  QStyleOptionViewItem *in_RSI;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  QRect rect;
  QDate date;
  QStyleOptionViewItem *in_stack_ffffffffffffff98;
  QCalendarWidgetPrivate *this_00;
  int in_stack_ffffffffffffffb0;
  QStyleOptionViewItem *painter_00;
  QStyledItemDelegate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCalendarWidgetPrivate **)(*(long *)&(in_RDI->super_QStyleOption).rect + 600);
  painter_00 = in_RDI;
  row = QModelIndex::row((QModelIndex *)in_RCX.jd);
  QModelIndex::column((QModelIndex *)in_RCX.jd);
  QCalendarModel::dateForCell((QCalendarModel *)in_RCX.jd,row,in_stack_ffffffffffffffb0);
  bVar2 = QDate::isValid((QDate *)CONCAT44(row,in_stack_ffffffffffffffb0));
  if (bVar2) {
    QStyleOptionViewItem::operator=(in_RDI,in_stack_ffffffffffffff98);
    QCalendarWidgetPrivate::paintCell
              (this_00,(QPainter *)in_RDI,(QRect *)in_stack_ffffffffffffff98,in_RCX);
  }
  else {
    QStyledItemDelegate::paint(in_stack_ffffffffffffffd8,(QPainter *)painter_00,in_RSI,in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarDelegate::paint(QPainter *painter, const QStyleOptionViewItem &option,
            const QModelIndex &index) const
{
    QDate date = calendarWidgetPrivate->m_model->dateForCell(index.row(), index.column());
    if (date.isValid()) {
        storedOption = option;
        QRect rect = option.rect;
        calendarWidgetPrivate->paintCell(painter, rect, date);
    } else {
        QStyledItemDelegate::paint(painter, option, index);
    }
}